

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float128_div_m68k(float128 a,float128 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte zSign;
  uint32_t bLow;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int32_t zExp;
  ulong uVar10;
  uint64_t aSig1;
  ulong uVar11;
  uint32_t aLow;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  float128 fVar21;
  int32_t bExp;
  int32_t aExp;
  uint local_9c;
  ulong local_98;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  uint64_t local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  float_status *local_48;
  uint64_t local_40;
  ulong local_38;
  
  local_78 = b.low;
  aSig1 = a.low;
  uVar17 = a.high & 0xffffffffffff;
  uVar9 = a.high._6_2_ & 0x7fff;
  local_70 = b.high & 0xffffffffffff;
  local_9c = b.high._6_2_ & 0x7fff;
  uVar15 = b.high ^ a.high;
  local_8c = uVar9;
  local_40 = aSig1;
  local_38 = uVar17;
  if (uVar9 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        aSig1 == 0) {
      if (local_9c != 0x7fff) goto LAB_006cbdfc;
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_78 == 0) goto LAB_006cbe1d;
    }
LAB_006cbc4f:
    fVar21 = propagateFloat128NaN(a,b,status);
    return fVar21;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_78 == 0) {
      if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
          aSig1 == 0) &&
          ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
LAB_006cbe1d:
        status->float_exception_flags = status->float_exception_flags | 1;
        fVar21.high = 0x7fffffffffffffff;
        fVar21.low = 0xffffffffffffffff;
        return fVar21;
      }
      status->float_exception_flags = status->float_exception_flags | 4;
LAB_006cbdfc:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar15 & 0x8000000000000000 | 0x7fff000000000000;
      return (float128)(auVar1 << 0x40);
    }
    normalizeFloat128Subnormal(local_70,local_78,(int32_t *)&local_9c,&local_70,&local_78);
LAB_006cbc85:
    local_48 = status;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          aSig1 == 0) goto LAB_006cc179;
      normalizeFloat128Subnormal(uVar17,aSig1,(int32_t *)&local_8c,&local_38,&local_40);
      uVar17 = local_38;
      aSig1 = local_40;
      uVar9 = local_8c;
    }
    uVar4 = aSig1 << 0xf;
    uVar18 = uVar17 << 0xf | aSig1 >> 0x31 | 0x8000000000000000;
    uVar12 = local_78 * 0x8000;
    uVar17 = local_70 << 0xf;
    local_80 = uVar17 | 0x8000000000000000;
    local_88 = local_78;
    local_98 = local_78 >> 0x31;
    uVar13 = local_98 | local_80;
    if ((uVar13 < uVar18) || (uVar12 <= uVar4 && uVar13 == uVar18)) {
      uVar18 = uVar18 >> 1;
      uVar4 = uVar4 >> 1 | (aSig1 >> 0x31) << 0x3f;
      zExp = (uVar9 - local_9c) + 0x3ffe;
    }
    else {
      zExp = (uVar9 - local_9c) + 0x3ffd;
    }
    local_58 = local_80 >> 0x20;
    if (uVar18 < uVar13) {
      uVar11 = uVar17 & 0xffffffff00000000 | 0x8000000000000000;
      uVar10 = 0xffffffff00000000;
      if (uVar18 < uVar11) {
        uVar10 = uVar18 / local_58 << 0x20;
      }
      local_98 = local_98 | uVar17 & 0xffffffff;
      uVar14 = (uVar10 >> 0x20) * local_98;
      uVar3 = uVar10 * uVar13;
      uVar7 = uVar4 - uVar3;
      lVar5 = ((uVar18 - ((uVar14 >> 0x20) + (uVar10 >> 0x20) * local_58)) - (ulong)(uVar4 < uVar3))
              - (ulong)(uVar3 < uVar14 << 0x20);
      if (lVar5 < 0) {
        uVar3 = (0x100000000 - uVar10) * uVar13 + uVar4;
        uVar14 = uVar7;
        do {
          uVar10 = uVar10 - 0x100000000;
          uVar7 = uVar14 + (uVar13 << 0x20);
          bVar20 = uVar3 < uVar14;
          uVar3 = uVar3 + (uVar13 << 0x20);
          lVar5 = lVar5 + local_58 + (ulong)bVar20;
          uVar14 = uVar7;
        } while (lVar5 < 0);
      }
      uVar7 = uVar7 >> 0x20 | lVar5 << 0x20;
      if (uVar7 < uVar11) {
        uVar7 = uVar7 / local_58;
      }
      else {
        uVar7 = 0xffffffff;
      }
      uVar7 = uVar7 | uVar10;
    }
    else {
      local_98 = local_98 | uVar17 & 0xffffffff;
      uVar7 = 0xffffffffffffffff;
    }
    local_60 = uVar12 >> 0x20;
    uVar3 = uVar7 >> 0x20;
    local_68 = uVar12 & 0xffffffff;
    uVar10 = (uVar7 & 0xffffffff) * local_60;
    lVar19 = 0;
    uVar11 = uVar10 + uVar3 * local_68;
    lVar5 = 0;
    if (CARRY8(uVar10,uVar3 * local_68)) {
      lVar5 = 0x100000000;
    }
    uVar10 = uVar7 * uVar12;
    uVar14 = (uVar7 & 0xffffffff) * local_58;
    uVar8 = uVar14 + uVar3 * local_98;
    if (CARRY8(uVar14,uVar3 * local_98)) {
      lVar19 = -0x100000000;
    }
    uVar6 = uVar7 * uVar13;
    uVar16 = uVar3 * local_60 + uVar6 + (uVar11 >> 0x20) + lVar5 + (ulong)(uVar10 < uVar11 << 0x20);
    uVar11 = -uVar10;
    uVar14 = (uVar4 - uVar16) - (ulong)(uVar10 != 0);
    lVar5 = (((((uVar18 - ((uVar8 >> 0x20) + uVar3 * local_58)) + lVar19) -
              (ulong)(uVar6 < uVar8 << 0x20)) - (ulong)(uVar16 < uVar6)) - (ulong)(uVar4 < uVar16))
            - (ulong)(uVar4 - uVar16 < (ulong)(uVar10 != 0));
    if (lVar5 < 0) {
      uVar4 = (uVar7 * -0x8000 + 0x8000) * local_78;
      do {
        uVar7 = uVar7 - 1;
        bVar20 = CARRY8(uVar14,uVar13);
        uVar18 = uVar14 + uVar13;
        uVar14 = uVar18 + (uVar4 < uVar11);
        lVar5 = lVar5 + (ulong)bVar20 + (ulong)CARRY8(uVar18,(ulong)(uVar4 < uVar11));
        uVar11 = uVar11 + uVar12;
        uVar4 = uVar4 + uVar12;
      } while (lVar5 < 0);
    }
    uVar4 = 0xffffffffffffffff;
    if (uVar14 < uVar13) {
      uVar4 = 0xffffffff00000000;
      uVar17 = uVar17 & 0xffffffff00000000 | 0x8000000000000000;
      if (uVar14 < uVar17) {
        uVar4 = uVar14 / local_58 << 0x20;
      }
      uVar3 = (uVar4 >> 0x20) * local_98;
      uVar10 = uVar4 * uVar13;
      uVar18 = uVar11 - uVar10;
      lVar5 = ((uVar14 - ((uVar3 >> 0x20) + (uVar4 >> 0x20) * local_58)) - (ulong)(uVar11 < uVar10))
              - (ulong)(uVar10 < uVar3 << 0x20);
      if (lVar5 < 0) {
        uVar10 = (0x100000000 - uVar4) * uVar13 + uVar11;
        uVar3 = uVar18;
        do {
          uVar4 = uVar4 - 0x100000000;
          uVar18 = uVar3 + (uVar13 << 0x20);
          bVar20 = uVar10 < uVar3;
          uVar10 = uVar10 + (uVar13 << 0x20);
          lVar5 = lVar5 + local_58 + (ulong)bVar20;
          uVar3 = uVar18;
        } while (lVar5 < 0);
      }
      uVar18 = uVar18 >> 0x20 | lVar5 << 0x20;
      if (uVar18 < uVar17) {
        uVar18 = uVar18 / local_58;
      }
      else {
        uVar18 = 0xffffffff;
      }
      uVar4 = uVar18 | uVar4;
      if (((uint)uVar18 & 0x3fff) < 5) {
        uVar17 = uVar4 >> 0x20;
        uVar10 = (uVar18 & 0xffffffff) * local_60;
        uVar3 = uVar10 + local_68 * uVar17;
        lVar5 = 0x100000000;
        if (!CARRY8(uVar10,local_68 * uVar17)) {
          lVar5 = 0;
        }
        uVar10 = (uVar18 & 0xffffffff) * local_58;
        uVar18 = uVar4 * uVar12;
        uVar8 = uVar10 + local_98 * uVar17;
        lVar19 = -0x100000000;
        if (!CARRY8(uVar10,local_98 * uVar17)) {
          lVar19 = 0;
        }
        uVar6 = uVar4 * uVar13;
        uVar3 = local_60 * uVar17 + uVar6 + (uVar3 >> 0x20) + lVar5 +
                (ulong)(uVar18 < uVar3 << 0x20);
        uVar10 = -uVar18;
        uVar16 = (uVar11 - uVar3) - (ulong)(uVar18 != 0);
        lVar5 = (((((uVar14 - ((uVar8 >> 0x20) + uVar17 * local_58)) + lVar19) -
                  (ulong)(uVar6 < uVar8 << 0x20)) - (ulong)(uVar3 < uVar6)) -
                (ulong)(uVar11 < uVar3)) - (ulong)(uVar11 - uVar3 < (ulong)(uVar18 != 0));
        if (lVar5 < 0) {
          uVar17 = local_78 * (uVar4 * -0x8000 + 0x8000);
          do {
            uVar4 = uVar4 - 1;
            bVar20 = CARRY8(uVar16,uVar13);
            uVar18 = uVar16 + uVar13;
            uVar16 = uVar18 + (uVar17 < uVar10);
            lVar5 = lVar5 + (ulong)bVar20 + (ulong)CARRY8(uVar18,(ulong)(uVar17 < uVar10));
            uVar10 = uVar10 + uVar12;
            uVar17 = uVar17 + uVar12;
          } while (lVar5 < 0);
        }
        uVar4 = uVar4 | ((lVar5 != 0 || uVar16 != 0) || uVar10 != 0);
      }
    }
    local_50._0_1_ = (byte)(uVar15 >> 0x3f);
    zSign = (byte)local_50;
    local_50 = uVar15 >> 0x3f;
    fVar21 = roundAndPackFloat128
                       (zSign,zExp,uVar7 >> 0xf,uVar7 << 0x31 | uVar4 >> 0xf,uVar4 << 0x31,local_48)
    ;
  }
  else {
    if (local_9c != 0x7fff) goto LAB_006cbc85;
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_78 != 0) goto LAB_006cbc4f;
LAB_006cc179:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar15 & 0x8000000000000000;
    fVar21 = (float128)(auVar2 << 0x40);
  }
  return fVar21;
}

Assistant:

float128 float128_div(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign, 0, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
            if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return float128_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = aExp - bExp + 0x3FFD;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000), aSig1, 15, &aSig0, &aSig1 );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    if ( le128( bSig0, bSig1, aSig0, aSig1 ) ) {
        shift128Right( aSig0, aSig1, 1, &aSig0, &aSig1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig0, aSig1, bSig0 );
    mul128By64To192( bSig0, bSig1, zSig0, &term0, &term1, &term2 );
    sub192( aSig0, aSig1, 0, term0, term1, term2, &rem0, &rem1, &rem2 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add192( rem0, rem1, rem2, 0, bSig0, bSig1, &rem0, &rem1, &rem2 );
    }
    zSig1 = estimateDiv128To64( rem1, rem2, bSig0 );
    if ( ( zSig1 & 0x3FFF ) <= 4 ) {
        mul128By64To192( bSig0, bSig1, zSig1, &term1, &term2, &term3 );
        sub192( rem1, rem2, 0, term1, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add192( rem1, rem2, rem3, 0, bSig0, bSig1, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 15, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}